

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdd-for-c.h
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  int iVar2;
  __bdd_array__ *p_Var3;
  char *pcVar4;
  __bdd_node__ *node;
  size_t i_1;
  ulong uVar5;
  size_t i_3;
  size_t i;
  size_t sVar6;
  long lVar7;
  __bdd_config_type__ config;
  
  config.test_index = 0;
  config.location = (char *)0x0;
  config.use_color = false;
  config.use_tap = false;
  config.has_focus_nodes = false;
  config._75_5_ = 0;
  config.nodes = (__bdd_array__ *)0x0;
  config.error = (char *)0x0;
  config.current_test = (__bdd_test_step__ *)0x0;
  config.node_stack = (__bdd_array__ *)0x0;
  config.test_tap_index = 0;
  config.failed_test_count = 0;
  config.run = __BDD_INIT_RUN__;
  config.id = 0;
  p_Var3 = __bdd_array_create__();
  config.node_stack = p_Var3;
  config.nodes = __bdd_array_create__();
  pcVar4 = getenv("BDD_USE_TAP");
  if (((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) || ((*pcVar4 == '0' && (pcVar4[1] == '\0')))) {
    iVar2 = fileno(_stdout);
    iVar2 = isatty(iVar2);
    if (iVar2 != 0) {
      _Var1 = __bdd_is_supported_term__();
      if (_Var1) {
        config.use_color = true;
      }
    }
  }
  else {
    config.use_tap = true;
  }
  iVar2 = 1;
  node = __bdd_node_create__(-1,__bdd_spec_name__,__BDD_NODE_GROUP__,__bdd_node_flags_none__);
  __bdd_array_push__(p_Var3,node);
  __bdd_test_main__(&config);
  p_Var3 = __bdd_array_create__();
  __bdd_node_flatten__(&config,node,p_Var3);
  lVar7 = 0;
  for (sVar6 = 0; p_Var3->size != sVar6; sVar6 = sVar6 + 1) {
    lVar7 = lVar7 + (ulong)(*(int *)((long)p_Var3->values[sVar6] + 0x18) == 2);
  }
  if (config.use_tap != false) {
    printf("TAP version 13\n1..%zu\n",lVar7);
  }
  config.run = __BDD_TEST_RUN__;
  for (uVar5 = 0; uVar5 < p_Var3->size; uVar5 = uVar5 + 1) {
    config.current_test = (__bdd_test_step__ *)p_Var3->values[uVar5];
    (config.node_stack)->size = 1;
    config._0_8_ = config._0_8_ & 0xffffffff;
    __bdd_run__(&config);
  }
  for (uVar5 = 0; uVar5 < (config.nodes)->size; uVar5 = uVar5 + 1) {
    __bdd_node_free__((__bdd_node__ *)(config.nodes)->values[uVar5]);
  }
  node->name = (char *)0x0;
  __bdd_node_free__(node);
  for (uVar5 = 0; uVar5 < p_Var3->size; uVar5 = uVar5 + 1) {
    free(p_Var3->values[uVar5]);
  }
  __bdd_array_free__(config.nodes);
  __bdd_array_free__(config.node_stack);
  __bdd_array_free__(p_Var3);
  if (config.failed_test_count == 0) {
    iVar2 = 0;
  }
  else if (config.use_tap == false) {
    pcVar4 = "s";
    if (lVar7 == 1) {
      pcVar4 = "";
    }
    printf("\n%zu test%s run, %zu failed.\n",lVar7,pcVar4);
  }
  return iVar2;
}

Assistant:

int main(void) {
    struct __bdd_config_type__ config = {
        .run = __BDD_INIT_RUN__,
        .id = 0,
        .test_index = 0,
        .test_tap_index = 0,
        .failed_test_count = 0,
        .node_stack = __bdd_array_create__(),
        .nodes = __bdd_array_create__(),
        .error = NULL,
        .use_color = 0,
        .use_tap = 0
    };

    const char *tap_env = getenv("BDD_USE_TAP");
    if (BDD_USE_TAP || (tap_env && strcmp(tap_env, "") != 0 && strcmp(tap_env, "0") != 0)) {
        config.use_tap = 1;
    }

    if (!config.use_tap && BDD_USE_COLOR && __BDD_IS_ATTY__() && __bdd_is_supported_term__()) {
        config.use_color = 1;
    }

    __bdd_node__ *root = __bdd_node_create__(-1, __bdd_spec_name__, __BDD_NODE_GROUP__, __bdd_node_flags_none__);
    __bdd_array_push__(config.node_stack, root);

    // During the first run we just gather the
    // count of the tests and their descriptions
    __bdd_test_main__(&config);

    __bdd_array__ *steps = __bdd_array_create__();
    __bdd_node_flatten__(&config, root, steps);

    size_t test_count = 0;
    for (size_t i = 0; i < steps->size; ++i) {
        __bdd_test_step__ *step = steps->values[i];
        if(step->type == __BDD_NODE_TEST__) {
            ++test_count;
        }
    }

    // Outputting the name of the suite
    if (config.use_tap) {
        printf("TAP version 13\n1..%zu\n", test_count);
    }

    config.run = __BDD_TEST_RUN__;

    for (size_t i = 0; i < steps->size; ++i) {
        __bdd_test_step__ *step = steps->values[i];
        config.node_stack->size = 1;
        config.id = 0;
        config.current_test = step;
        __bdd_run__(&config);
    }

    for (size_t i = 0; i < config.nodes->size; ++i) {
        __bdd_node_free__(config.nodes->values[i]);
    }
    root->name = NULL; // name is statically allocated
    __bdd_node_free__(root);
    for (size_t i = 0; i < steps->size; ++i) {
        free(steps->values[i]);
    }
    __bdd_array_free__(config.nodes);
    __bdd_array_free__(config.node_stack);
    __bdd_array_free__(steps);

    if (config.failed_test_count > 0) {
        if (!config.use_tap) {
            printf(
                "\n%zu test%s run, %zu failed.\n",
                test_count, test_count == 1 ? "" : "s", config.failed_test_count
            );
        }
        return 1;
    }
    return 0;
}